

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O3

CURLcode get_url_file_name(GlobalConfig *global,char **filename,char *url)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char *__s;
  char *path;
  char *local_38;
  
  lVar5 = curl_url();
  local_38 = (char *)0x0;
  if (lVar5 == 0) {
    return CURLE_OUT_OF_MEMORY;
  }
  *filename = (char *)0x0;
  iVar4 = curl_url_set(lVar5,0,url,0x200);
  if (iVar4 == 0) {
    iVar4 = curl_url_get(lVar5,7,&local_38,0);
    curl_url_cleanup(lVar5);
    if (iVar4 == 0) {
      bVar1 = 0;
      bVar3 = true;
      do {
        while( true ) {
          bVar2 = bVar3;
          pcVar7 = local_38;
          pcVar6 = strrchr(local_38,0x2f);
          __s = pcVar6 + 1;
          if (pcVar6 == (char *)0x0) {
            __s = pcVar7;
          }
          pcVar7 = strrchr(__s,0x5c);
          if (pcVar7 == (char *)0x0) {
            pcVar7 = pcVar6;
          }
          if (pcVar7 != (char *)0x0) break;
          bVar1 = 1;
          bVar3 = false;
          if (!bVar2) {
LAB_0011a0cb:
            pcVar7 = "curl_response";
            warnf(global,"No remote file name, uses \"%s\"","curl_response");
LAB_0011a0e6:
            pcVar7 = strdup(pcVar7);
            *filename = pcVar7;
            curl_free(local_38);
            if (*filename == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            return CURLE_OK;
          }
        }
        if (!(bool)(bVar1 | pcVar7[1] != '\0')) {
          *pcVar7 = '\0';
        }
        bVar1 = 1;
        bVar3 = false;
      } while (bVar2);
      if (pcVar7 != (char *)0x0) {
        pcVar7 = pcVar7 + 1;
        goto LAB_0011a0e6;
      }
      goto LAB_0011a0cb;
    }
    lVar5 = 0;
  }
  curl_url_cleanup(lVar5);
  if (iVar4 < 7) {
    if (iVar4 == 1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if (iVar4 == 5) {
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
  }
  else {
    if (iVar4 == 7) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (iVar4 == 0x1e) {
      return CURLE_NOT_BUILT_IN;
    }
  }
  return CURLE_URL_MALFORMAT;
}

Assistant:

CURLcode get_url_file_name(struct GlobalConfig *global,
                           char **filename, const char *url)
{
  CURLU *uh = curl_url();
  char *path = NULL;
  CURLUcode uerr;

  if(!uh)
    return CURLE_OUT_OF_MEMORY;

  *filename = NULL;

  uerr = curl_url_set(uh, CURLUPART_URL, url, CURLU_GUESS_SCHEME);
  if(!uerr) {
    uerr = curl_url_get(uh, CURLUPART_PATH, &path, 0);
    curl_url_cleanup(uh);
    uh = NULL;
    if(!uerr) {
      int i;
      char *pc = NULL, *pc2 = NULL;
      for(i = 0; i < 2; i++) {
        pc = strrchr(path, '/');
        pc2 = strrchr(pc ? pc + 1 : path, '\\');
        if(pc2)
          pc = pc2;
        if(pc && !pc[1] && !i) {
          /* if the path ends with slash, try removing the trailing one
             and get the last directory part */
          *pc = 0;
        }
      }

      if(pc)
        /* duplicate the string beyond the slash */
        pc++;
      else {
        /* no slash => empty string, use default */
        pc = (char *)"curl_response";
        warnf(global, "No remote file name, uses \"%s\"", pc);
      }

      *filename = strdup(pc);
      curl_free(path);
      if(!*filename)
        return CURLE_OUT_OF_MEMORY;

#if defined(_WIN32) || defined(MSDOS)
      {
        char *sanitized;
        SANITIZEcode sc = sanitize_file_name(&sanitized, *filename, 0);
        Curl_safefree(*filename);
        if(sc) {
          if(sc == SANITIZE_ERR_OUT_OF_MEMORY)
            return CURLE_OUT_OF_MEMORY;
          return CURLE_URL_MALFORMAT;
        }
        *filename = sanitized;
      }
#endif /* _WIN32 || MSDOS */

      /* in case we built debug enabled, we allow an environment variable
       * named CURL_TESTDIR to prefix the given filename to put it into a
       * specific directory
       */
#ifdef DEBUGBUILD
      {
        char *tdir = curl_getenv("CURL_TESTDIR");
        if(tdir) {
          char *alt = aprintf("%s/%s", tdir, *filename);
          Curl_safefree(*filename);
          *filename = alt;
          curl_free(tdir);
          if(!*filename)
            return CURLE_OUT_OF_MEMORY;
        }
      }
#endif
      return CURLE_OK;
    }
  }
  curl_url_cleanup(uh);
  return urlerr_cvt(uerr);
}